

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QStandardItemData>::moveAppend
          (QGenericArrayOps<QStandardItemData> *this,QStandardItemData *b,QStandardItemData *e)

{
  QStandardItemData *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QStandardItemData *in_RDI;
  QStandardItemData *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QStandardItemData>::begin
                        ((QArrayDataPointer<QStandardItemData> *)0x8dfbb7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QStandardItemData::QStandardItemData(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      *(long *)((long)&(in_RDI->value).d.data + 8) =
           *(long *)((long)&(in_RDI->value).d.data + 8) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }